

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  SecondaryInstanceWidget *this;
  undefined4 *puVar3;
  QObject local_68 [8];
  KDSingleApplication kdsa;
  int argc_local;
  QApplication app;
  code *local_30;
  ImplFn local_28;
  code *local_20;
  undefined8 local_18;
  
  argc_local = argc;
  QApplication::QApplication(&app,&argc_local,argv,0x60204);
  KDSingleApplication::KDSingleApplication(&kdsa,(QObject *)0x0);
  cVar1 = KDSingleApplication::isPrimaryInstance();
  if (cVar1 == '\0') {
    this = (SecondaryInstanceWidget *)operator_new(0x38);
    SecondaryInstanceWidget::SecondaryInstanceWidget(this,&kdsa,(QWidget *)0x0);
  }
  else {
    this = (SecondaryInstanceWidget *)operator_new(0x30);
    PrimaryInstanceWidget::PrimaryInstanceWidget((PrimaryInstanceWidget *)this,(QWidget *)0x0);
    local_20 = KDSingleApplication::messageReceived;
    local_18 = 0;
    local_30 = PrimaryInstanceWidget::addMessage;
    local_28 = (ImplFn)0x0;
    puVar3 = (undefined4 *)operator_new(0x20);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::
         QSlotObject<void_(PrimaryInstanceWidget::*)(const_QByteArray_&),_QtPrivate::List<const_QByteArray_&>,_void>
         ::impl;
    *(code **)(puVar3 + 4) = PrimaryInstanceWidget::addMessage;
    *(undefined8 *)(puVar3 + 6) = 0;
    QObject::connectImpl
              (local_68,(void **)&kdsa,(QObject *)&local_20,(void **)this,
               (QSlotObjectBase *)&local_30,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_68);
  }
  QWidget::setAttribute((WidgetAttribute)this,true);
  QWidget::show();
  iVar2 = QApplication::exec();
  KDSingleApplication::~KDSingleApplication(&kdsa);
  QApplication::~QApplication(&app);
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
    QApplication app(argc, argv);

    KDSingleApplication kdsa;

    QWidget *widget;

    if (kdsa.isPrimaryInstance()) {
        PrimaryInstanceWidget *piw = new PrimaryInstanceWidget;
        QObject::connect(&kdsa, &KDSingleApplication::messageReceived,
                         piw, &PrimaryInstanceWidget::addMessage);

        widget = piw;
    } else {
        SecondaryInstanceWidget *siw = new SecondaryInstanceWidget(&kdsa);
        widget = siw;
    }

    widget->setAttribute(Qt::WA_DeleteOnClose);
    widget->show();

    return app.exec();
}